

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall
xLearn::MODEL_TEST_SerializeToTXT_Test::TestBody(MODEL_TEST_SerializeToTXT_Test *this)

{
  string *score_func;
  string *loss_func;
  Model model_ffm;
  Model model_fm;
  Model model_lr;
  HyperParam hyper_param;
  allocator local_3f1;
  string local_3f0;
  Model local_3d0;
  Model local_340;
  Model local_2b0;
  HyperParam local_220;
  
  Init();
  score_func = &local_220.score_func;
  std::__cxx11::string::assign((char *)score_func);
  local_2b0.score_func_._M_dataplus._M_p = (pointer)&local_2b0.score_func_.field_2;
  loss_func = &local_220.loss_func;
  local_2b0.score_func_._M_string_length = 0;
  local_2b0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2b0.loss_func_._M_dataplus._M_p = (pointer)&local_2b0.loss_func_.field_2;
  local_2b0.loss_func_._M_string_length = 0;
  local_2b0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2b0.param_w_ = (real_t *)0x0;
  local_2b0.param_v_ = (real_t *)0x0;
  local_2b0.param_b_ = (real_t *)0x0;
  local_2b0.param_best_w_ = (real_t *)0x0;
  local_2b0.param_best_v_ = (real_t *)0x0;
  local_2b0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2b0,score_func,loss_func,local_220.num_feature,local_220.num_field,
                    local_220.num_K,local_220.auxiliary_size,0.5);
  std::__cxx11::string::string((string *)&local_340,"test_txt.linear",(allocator *)&local_3d0);
  Model::SerializeToTXT(&local_2b0,&local_340.score_func_);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::assign((char *)score_func);
  local_340.score_func_._M_dataplus._M_p = (pointer)&local_340.score_func_.field_2;
  local_340.score_func_._M_string_length = 0;
  local_340.score_func_.field_2._M_local_buf[0] = '\0';
  local_340.loss_func_._M_dataplus._M_p = (pointer)&local_340.loss_func_.field_2;
  local_340.loss_func_._M_string_length = 0;
  local_340.loss_func_.field_2._M_local_buf[0] = '\0';
  local_340.param_w_ = (real_t *)0x0;
  local_340.param_v_ = (real_t *)0x0;
  local_340.param_b_ = (real_t *)0x0;
  local_340.param_best_w_ = (real_t *)0x0;
  local_340.param_best_v_ = (real_t *)0x0;
  local_340.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_340,score_func,loss_func,local_220.num_feature,local_220.num_field,
                    local_220.num_K,local_220.auxiliary_size,0.5);
  std::__cxx11::string::string((string *)&local_3d0,"test_txt.fm",(allocator *)&local_3f0);
  Model::SerializeToTXT(&local_340,&local_3d0.score_func_);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::assign((char *)score_func);
  local_3d0.score_func_._M_dataplus._M_p = (pointer)&local_3d0.score_func_.field_2;
  local_3d0.score_func_._M_string_length = 0;
  local_3d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_3d0.loss_func_._M_dataplus._M_p = (pointer)&local_3d0.loss_func_.field_2;
  local_3d0.loss_func_._M_string_length = 0;
  local_3d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_3d0.param_w_ = (real_t *)0x0;
  local_3d0.param_v_ = (real_t *)0x0;
  local_3d0.param_b_ = (real_t *)0x0;
  local_3d0.param_best_w_ = (real_t *)0x0;
  local_3d0.param_best_v_ = (real_t *)0x0;
  local_3d0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_3d0,score_func,loss_func,local_220.num_feature,local_220.num_field,
                    local_220.num_K,local_220.auxiliary_size,0.5);
  std::__cxx11::string::string((string *)&local_3f0,"test_txt.ffm",&local_3f1);
  Model::SerializeToTXT(&local_3d0,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  Model::~Model(&local_3d0);
  Model::~Model(&local_340);
  Model::~Model(&local_2b0);
  HyperParam::~HyperParam(&local_220);
  return;
}

Assistant:

TEST(MODEL_TEST, SerializeToTXT) {
  HyperParam hyper_param = Init();
  // linear
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_lr.SerializeToTXT("test_txt.linear");
  // fm
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_fm.SerializeToTXT("test_txt.fm");
  // ffm
  hyper_param.score_func = "ffm";
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  model_ffm.SerializeToTXT("test_txt.ffm");
}